

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall
spv::Builder::makeSwitch
          (Builder *this,Id selector,uint control,int numSegments,Vector<int> *caseValues,
          Vector<int> *valueIndexToSegment,int defaultSegment,Vector<Block_*> *segmentBlocks)

{
  int iVar1;
  Id IVar2;
  Block *pBVar3;
  reference ppBVar4;
  size_type sVar5;
  uint *puVar6;
  const_reference pvVar7;
  undefined4 in_register_00000034;
  value_type *__x;
  Block *local_c0;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_80;
  int local_74;
  Block *pBStack_70;
  int i;
  Block *defaultOrMerge;
  Instruction *switchInst;
  Block *mergeBlock;
  Block *local_48;
  int local_3c;
  Function *pFStack_38;
  int s;
  Function *function;
  Vector<int> *valueIndexToSegment_local;
  Vector<int> *caseValues_local;
  uint local_18;
  int numSegments_local;
  uint control_local;
  Id selector_local;
  Builder *this_local;
  
  __x = (value_type *)CONCAT44(in_register_00000034,selector);
  function = (Function *)valueIndexToSegment;
  valueIndexToSegment_local = caseValues;
  caseValues_local._4_4_ = numSegments;
  local_18 = control;
  numSegments_local = selector;
  _control_local = this;
  pFStack_38 = Block::getParent(this->buildPoint);
  for (local_3c = 0; local_3c < caseValues_local._4_4_; local_3c = local_3c + 1) {
    pBVar3 = (Block *)Block::operator_new((Block *)0x78,(size_t)__x);
    IVar2 = getUniqueId(this);
    Block::Block(pBVar3,IVar2,pFStack_38);
    __x = &local_48;
    local_48 = pBVar3;
    std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::push_back
              (segmentBlocks,__x);
  }
  pBVar3 = (Block *)Block::operator_new((Block *)0x78,(size_t)__x);
  IVar2 = getUniqueId(this);
  Block::Block(pBVar3,IVar2,pFStack_38);
  switchInst = (Instruction *)pBVar3;
  createSelectionMerge(this,pBVar3,local_18);
  pBVar3 = (Block *)Instruction::operator_new((Instruction *)0x38,(size_t)pBVar3);
  Instruction::Instruction((Instruction *)pBVar3,0,0,OpSwitch);
  defaultOrMerge = pBVar3;
  Instruction::addIdOperand((Instruction *)pBVar3,numSegments_local);
  if (defaultSegment < 0) {
    local_c0 = (Block *)switchInst;
  }
  else {
    ppBVar4 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)defaultSegment);
    local_c0 = *ppBVar4;
  }
  pBVar3 = defaultOrMerge;
  pBStack_70 = local_c0;
  IVar2 = Block::getId(local_c0);
  Instruction::addIdOperand((Instruction *)pBVar3,IVar2);
  Block::addPredecessor(pBStack_70,this->buildPoint);
  local_74 = 0;
  while( true ) {
    iVar1 = local_74;
    sVar5 = std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::size(valueIndexToSegment_local);
    pBVar3 = defaultOrMerge;
    if ((int)sVar5 <= iVar1) break;
    puVar6 = (uint *)std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::operator[]
                               (valueIndexToSegment_local,(long)local_74);
    Instruction::addImmediateOperand((Instruction *)pBVar3,*puVar6);
    pBVar3 = defaultOrMerge;
    pvVar7 = std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::operator[]
                       ((vector<int,_dxil_spv::ThreadLocalAllocator<int>_> *)function,(long)local_74
                       );
    ppBVar4 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)*pvVar7);
    IVar2 = Block::getId(*ppBVar4);
    Instruction::addIdOperand((Instruction *)pBVar3,IVar2);
    pvVar7 = std::vector<int,_dxil_spv::ThreadLocalAllocator<int>_>::operator[]
                       ((vector<int,_dxil_spv::ThreadLocalAllocator<int>_> *)function,(long)local_74
                       );
    ppBVar4 = std::vector<spv::Block_*,_dxil_spv::ThreadLocalAllocator<spv::Block_*>_>::operator[]
                        (segmentBlocks,(long)*pvVar7);
    Block::addPredecessor(*ppBVar4,this->buildPoint);
    local_74 = local_74 + 1;
  }
  pBVar3 = this->buildPoint;
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_80,
             (pointer)defaultOrMerge);
  Block::addInstruction(pBVar3,&local_80);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_80);
  std::stack<spv::Block_*,_std::deque<spv::Block_*,_std::allocator<spv::Block_*>_>_>::push
            (&this->switchMerges,(value_type *)&switchInst);
  return;
}

Assistant:

void Builder::makeSwitch(Id selector, unsigned int control, int numSegments, const dxil_spv::Vector<int>& caseValues,
                         const dxil_spv::Vector<int>& valueIndexToSegment, int defaultSegment,
                         dxil_spv::Vector<Block*>& segmentBlocks)
{
    Function& function = buildPoint->getParent();

    // make all the blocks
    for (int s = 0; s < numSegments; ++s)
        segmentBlocks.push_back(new Block(getUniqueId(), function));

    Block* mergeBlock = new Block(getUniqueId(), function);

    // make and insert the switch's selection-merge instruction
    createSelectionMerge(mergeBlock, control);

    // make the switch instruction
    Instruction* switchInst = new Instruction(NoResult, NoType, OpSwitch);
    switchInst->addIdOperand(selector);
    auto defaultOrMerge = (defaultSegment >= 0) ? segmentBlocks[defaultSegment] : mergeBlock;
    switchInst->addIdOperand(defaultOrMerge->getId());
    defaultOrMerge->addPredecessor(buildPoint);
    for (int i = 0; i < (int)caseValues.size(); ++i) {
        switchInst->addImmediateOperand(caseValues[i]);
        switchInst->addIdOperand(segmentBlocks[valueIndexToSegment[i]]->getId());
        segmentBlocks[valueIndexToSegment[i]]->addPredecessor(buildPoint);
    }
    buildPoint->addInstruction(std::unique_ptr<Instruction>(switchInst));

    // push the merge block
    switchMerges.push(mergeBlock);
}